

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

TestBuilder * __thiscall
anon_unknown.dwarf_15bc091::TestBuilder::Push(TestBuilder *this,CPubKey *pubkey)

{
  byte bVar1;
  long lVar2;
  long in_FS_OFFSET;
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0x21;
  if ((pubkey->vch[0] & 0xfe) != 2) {
    bVar1 = pubkey->vch[0] - 4;
    if (bVar1 < 4) {
      lVar2 = (&DAT_00e5ea00)[bVar1];
    }
    else {
      lVar2 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_30,pubkey->vch,
             pubkey->vch + lVar2,&local_31);
  DoPush(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& Push(const CPubKey& pubkey)
    {
        DoPush(std::vector<unsigned char>(pubkey.begin(), pubkey.end()));
        return *this;
    }